

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

bool __thiscall
MT32Emu::MidiEventQueue::pushSysex
          (MidiEventQueue *this,Bit8u *sysexData,Bit32u sysexLength,Bit32u timestamp)

{
  int iVar1;
  undefined4 extraout_var;
  uint uVar2;
  MidiEvent *pMVar3;
  Bit8u *dstSysexData;
  MidiEvent *newEvent;
  Bit32u newEndPosition;
  Bit32u timestamp_local;
  Bit32u sysexLength_local;
  Bit8u *sysexData_local;
  MidiEventQueue *this_local;
  Bit8u *__dest;
  
  uVar2 = this->endPosition + 1 & this->ringBufferMask;
  if (this->startPosition == uVar2) {
    this_local._7_1_ = false;
  }
  else {
    pMVar3 = this->ringBuffer + this->endPosition;
    (*this->sysexDataStorage->_vptr_SysexDataStorage[4])
              (this->sysexDataStorage,pMVar3->sysexData,(ulong)(pMVar3->field_1).sysexLength);
    iVar1 = (*this->sysexDataStorage->_vptr_SysexDataStorage[2])
                      (this->sysexDataStorage,(ulong)sysexLength);
    __dest = (Bit8u *)CONCAT44(extraout_var,iVar1);
    if (__dest == (Bit8u *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      memcpy(__dest,sysexData,(ulong)sysexLength);
      pMVar3->sysexData = __dest;
      (pMVar3->field_1).sysexLength = sysexLength;
      pMVar3->timestamp = timestamp;
      this->endPosition = uVar2;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool MidiEventQueue::pushSysex(const Bit8u *sysexData, Bit32u sysexLength, Bit32u timestamp) {
	Bit32u newEndPosition = (endPosition + 1) & ringBufferMask;
	// If ring buffer is full, bail out.
	if (startPosition == newEndPosition) return false;
	volatile MidiEvent &newEvent = ringBuffer[endPosition];
	sysexDataStorage.dispose(newEvent.sysexData, newEvent.sysexLength);
	Bit8u *dstSysexData = sysexDataStorage.allocate(sysexLength);
	if (dstSysexData == NULL) return false;
	memcpy(dstSysexData, sysexData, sysexLength);
	newEvent.sysexData = dstSysexData;
	newEvent.sysexLength = sysexLength;
	newEvent.timestamp = timestamp;
	endPosition = newEndPosition;
	return true;
}